

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O2

int str_copy(CONF *conf,char *section,char **pto,char *from)

{
  int iVar1;
  BUF_MEM *str;
  size_t sVar2;
  undefined4 extraout_var;
  long lVar3;
  char cVar4;
  char cVar5;
  long lVar6;
  
  str = BUF_MEM_new();
  if (str == (BUF_MEM *)0x0) {
    return 0;
  }
  sVar2 = strlen(section);
  iVar1 = BUF_MEM_grow(str,(long)((int)sVar2 + 1));
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = 0;
LAB_003db28d:
    while( true ) {
      cVar4 = *section;
      lVar3 = (long)iVar1;
      if ((cVar4 != '\"') && (cVar4 != '\'')) break;
LAB_003db2d5:
      cVar5 = section[1];
      lVar6 = 1;
      if ((cVar5 == '\0') || (cVar5 == cVar4)) goto LAB_003db2fd;
      if (cVar5 != '\\') {
        section = section + 1;
LAB_003db2ca:
        str->data[lVar3] = cVar5;
        lVar3 = lVar3 + 1;
        goto LAB_003db2d5;
      }
      cVar5 = section[2];
      if (cVar5 != '\0') {
        section = section + 2;
        goto LAB_003db2ca;
      }
      cVar5 = '\0';
      lVar6 = 2;
LAB_003db2fd:
      section = section + (ulong)(cVar5 == cVar4) + lVar6;
      iVar1 = (int)lVar3;
    }
    if (cVar4 == '\\') {
      cVar5 = section[1];
      if (cVar5 == 'b') {
        cVar4 = '\b';
      }
      else if (cVar5 == 'n') {
        cVar4 = '\n';
      }
      else {
        cVar4 = '\r';
        if (cVar5 != 'r') {
          if (cVar5 == '\0') goto LAB_003db35e;
          cVar4 = cVar5;
          if (cVar5 == 't') {
            cVar4 = '\t';
          }
        }
      }
      section = section + 2;
    }
    else {
      if (cVar4 == '`') goto LAB_003db2d5;
      if (cVar4 == '\0') {
LAB_003db35e:
        str->data[lVar3] = '\0';
        OPENSSL_free(conf->values);
        conf->values = (lhash_st_CONF_VALUE *)str->data;
        OPENSSL_free(str);
        return 1;
      }
      if (cVar4 == '$') goto LAB_003db382;
      section = section + 1;
    }
    iVar1 = iVar1 + 1;
    str->data[lVar3] = cVar4;
    goto LAB_003db28d;
  }
LAB_003db39c:
  BUF_MEM_free(str);
  return 0;
LAB_003db382:
  ERR_put_error(0xd,0,0x6b,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                ,0xdb);
  goto LAB_003db39c;
}

Assistant:

static int str_copy(CONF *conf, char *section, char **pto, char *from) {
  int q, to = 0, len = 0;
  char v;
  BUF_MEM *buf;

  buf = BUF_MEM_new();
  if (buf == NULL) {
    return 0;
  }

  len = strlen(from) + 1;
  if (!BUF_MEM_grow(buf, len)) {
    goto err;
  }

  for (;;) {
    if (is_quote(*from)) {
      q = *from;
      from++;
      while (*from != '\0' && *from != q) {
        if (is_esc(*from)) {
          from++;
          if (*from == '\0') {
            break;
          }
        }
        buf->data[to++] = *(from++);
      }
      if (*from == q) {
        from++;
      }
    } else if (is_esc(*from)) {
      from++;
      v = *(from++);
      if (v == '\0') {
        break;
      } else if (v == 'r') {
        v = '\r';
      } else if (v == 'n') {
        v = '\n';
      } else if (v == 'b') {
        v = '\b';
      } else if (v == 't') {
        v = '\t';
      }
      buf->data[to++] = v;
    } else if (*from == '\0') {
      break;
    } else if (*from == '$') {
      // Historically, $foo would expand to a previously-parsed value. This
      // feature has been removed as it was unused and is a DoS vector. If
      // trying to embed '$' in a line, either escape it or wrap the value in
      // quotes.
      OPENSSL_PUT_ERROR(CONF, CONF_R_VARIABLE_EXPANSION_NOT_SUPPORTED);
      goto err;
    } else {
      buf->data[to++] = *(from++);
    }
  }

  buf->data[to] = '\0';
  OPENSSL_free(*pto);
  *pto = buf->data;
  OPENSSL_free(buf);
  return 1;

err:
  BUF_MEM_free(buf);
  return 0;
}